

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void jsonnet_ext_code(JsonnetVm *vm,char *key,char *val)

{
  mapped_type *this;
  allocator<char> local_82;
  allocator<char> local_81;
  key_type local_80;
  VmExt local_60;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,val,&local_81);
  std::__cxx11::string::string((string *)&local_60,local_38);
  local_60.isCode = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,key,&local_82);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         ::operator[](&vm->ext,&local_80);
  jsonnet::internal::VmExt::operator=(this,&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void jsonnet_ext_code(JsonnetVm *vm, const char *key, const char *val)
{
    vm->ext[key] = VmExt(val, true);
}